

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Coordinates(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAMFImporter_NodeElement *pCVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var7;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *__end;
  float fVar9;
  string local_80;
  uint local_5c;
  uint local_58;
  uint local_54;
  string local_50;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x60);
  pCVar3 = this->mNodeElement_Cur;
  pNode->Type = ENET_Coordinates;
  paVar8 = &(pNode->ID).field_2;
  (pNode->ID)._M_dataplus._M_p = (pointer)paVar8;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode[1]._vptr_CAMFImporter_NodeElement = (_func_int **)0x0;
  pNode->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_0080e580;
  pNode[1].Type = ENET_Color;
  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar6 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar6 == '\0') {
      local_5c = 0;
      local_54 = 0;
      local_58 = 0;
    }
    else {
      paVar2 = &local_80.field_2;
      local_58 = 0;
      local_54 = 0;
      local_5c = 0;
      do {
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar6 == 1) {
          local_80._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"x","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar6 = std::__cxx11::string::compare((char *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (iVar6 == 0) {
            if ((local_5c & 1) != 0) {
              local_80._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"x","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_80,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != paVar2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
            }
            fVar9 = XML_ReadNode_GetVal_AsFloat(this);
            *(float *)&pNode[1]._vptr_CAMFImporter_NodeElement = fVar9;
            iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            cVar5 = (char)iVar6;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)CONCAT71((int7)((ulong)paVar8 >> 8),1);
            local_5c = (uint)paVar8;
          }
          else {
            local_80._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"y","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare((char *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 == 0) {
              if ((local_54 & 1) != 0) {
                local_80._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"y","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_80,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != paVar2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
              }
              fVar9 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)((long)&pNode[1]._vptr_CAMFImporter_NodeElement + 4) = fVar9;
              iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              cVar5 = (char)iVar6;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71((int7)((ulong)paVar8 >> 8),1);
              local_54 = (uint)paVar8;
            }
            else {
              local_80._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"z","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar6 = std::__cxx11::string::compare((char *)&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != paVar2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar6 != 0) {
                local_80._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_80,"coordinates","");
                XML_CheckNode_SkipUnsupported(this,&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != paVar2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                goto LAB_003e0cd8;
              }
              if ((local_58 & 1) != 0) {
                local_80._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"z","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_80,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != paVar2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
              }
              fVar9 = XML_ReadNode_GetVal_AsFloat(this);
              pNode[1].Type = (EType)fVar9;
              iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              cVar5 = (char)iVar6;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71((int7)((ulong)paVar8 >> 8),1);
              local_58 = (uint)paVar8;
            }
          }
        }
        else {
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 == 2) {
            local_80._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"coordinates","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare((char *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 == 0) goto LAB_003e0f59;
          }
LAB_003e0cd8:
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          cVar5 = (char)iVar6;
        }
      } while (cVar5 != '\0');
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"coordinates","");
    Throw_CloseNotFound(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
LAB_003e0f59:
    uVar4 = local_5c;
    ParseHelper_Node_Exit(this);
    if ((((uVar4 & 1) == 0) || ((local_54 & 1) == 0)) || ((char)local_58 == '\0')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Not all coordinate\'s components are defined.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_80);
      *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void AMFImporter::ParseNode_Coordinates()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Coordinates(mNodeElement_Cur);

	CAMFImporter_NodeElement_Coordinates& als = *((CAMFImporter_NodeElement_Coordinates*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("coordinates");
			MACRO_NODECHECK_READCOMP_F("x", read_flag[0], als.Coordinate.x);
			MACRO_NODECHECK_READCOMP_F("y", read_flag[1], als.Coordinate.y);
			MACRO_NODECHECK_READCOMP_F("z", read_flag[2], als.Coordinate.z);
		MACRO_NODECHECK_LOOPEND("coordinates");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all coordinate's components are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}